

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_ru_operation<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>
               (void)

{
  uint uVar1;
  pointer ppVar2;
  pointer pvVar3;
  Column_zp_settings *this;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *pvVar4;
  undefined4 uVar5;
  ulong uVar6;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  uColumns;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>
  m;
  anon_class_1_0_00000001 local_17a;
  anon_class_1_0_00000001 local_179;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_178;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_158;
  anon_class_1_0_00000001 local_121;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_120;
  anon_class_8_1_e4bd5e45 local_108;
  undefined1 local_100 [88];
  pointer local_a8;
  pointer local_80;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  local_100._0_8_ = this;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>
  ::
  RU_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>
              *)(local_100 + 8),&local_120,this);
  ppVar2 = local_120.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_120.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    local_120.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  local_178.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar4 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
            *)operator_new(0xa8);
  local_178.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pvVar4;
  local_178.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pvVar4 + 0xa8);
  memset(pvVar4,0,0xa8);
  local_158._M_impl._0_8_ = 0x100000000;
  local_178.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pvVar4 + 0xa8);
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>(pvVar4,&local_158);
  local_158._M_impl._0_8_ = 0x100000001;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_178.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x18),&local_158);
  local_158._M_impl._0_8_ = 0x100000002;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_178.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x30),&local_158);
  local_158._M_impl._0_8_ = 0x100000003;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_178.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x48),&local_158);
  local_158._M_impl._0_8_ = 0x100000004;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_178.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x60),&local_158);
  local_158._M_impl._0_8_ = 0x400000003;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = 4;
  local_158._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x100000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_178.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x78),&local_158);
  local_158._M_impl._0_8_ = 0x100000006;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_178.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x90),&local_158);
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>
            (&local_120,
             (Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>
              *)local_100);
  pvVar3 = local_178.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_178.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_178.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0;
    pvVar4 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)local_178.
                super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    do {
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)&local_158,local_80 + uVar6);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)pvVar4,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)&local_158);
      std::
      _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_158);
      pvVar4 = pvVar4 + 0x18;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (pvVar4 != (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                        *)pvVar3);
  }
  local_158._M_impl._0_8_ = local_a8 + 5;
  local_108.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>
        *)local_158._M_impl._0_8_;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence____udhi::persistence_matrix::Column_types)7,false,true,true,false>>__Matrix_column_tag_1u>_false>___1_>
            (local_a8 + 3,
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>
              *)local_158._M_impl._0_8_,&local_179,(anon_class_8_1_e4bd5e45 *)&local_158,&local_108,
             &local_17a,&local_121);
  local_158._M_impl._0_8_ = local_80 + 5;
  local_108.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>
        *)local_158._M_impl._0_8_;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence____udhi::persistence_matrix::Column_types)7,false,true,true,false>>__Matrix_column_tag_1u>_false>___1_>
            (local_80 + 3,
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>
              *)local_158._M_impl._0_8_,&local_179,(anon_class_8_1_e4bd5e45 *)&local_158,&local_108,
             &local_17a,&local_121);
  local_158._M_impl._0_8_ = 0x100000000;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
  local_158._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_120.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_158);
  local_158._M_impl._0_8_ = 0x400000004;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = 5;
  local_158._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_178.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x78),&local_158);
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>
            (&local_120,
             (Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>
              *)local_100);
  pvVar3 = local_178.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_178.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_178.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0;
    pvVar4 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)local_178.
                super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    do {
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)&local_158,local_80 + uVar6);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)pvVar4,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)&local_158);
      std::
      _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_158);
      pvVar4 = pvVar4 + 0x18;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (pvVar4 != (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                        *)pvVar3);
  }
  local_158._M_impl._0_8_ = local_a8 + 5;
  local_108.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>
        *)local_158._M_impl._0_8_;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence____udhi::persistence_matrix::Column_types)7,false,true,true,false>>__Matrix_column_tag_1u>_false>___1_>
            (local_a8 + 4,
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>
              *)local_158._M_impl._0_8_,&local_179,(anon_class_8_1_e4bd5e45 *)&local_158,&local_108,
             &local_17a,&local_121);
  local_158._M_impl._0_8_ = local_80 + 5;
  local_108.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>
        *)local_158._M_impl._0_8_;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence____udhi::persistence_matrix::Column_types)7,false,true,true,false>>__Matrix_column_tag_1u>_false>___1_>
            (local_80 + 4,
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>
              *)local_158._M_impl._0_8_,&local_179,(anon_class_8_1_e4bd5e45 *)&local_158,&local_108,
             &local_17a,&local_121);
  local_158._M_impl._0_8_ = 0x100000000;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  local_158._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_120.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_158);
  local_158._M_impl._0_8_ = 0x100000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_178.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x78),&local_158);
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>
            (&local_120,
             (Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>
              *)local_100);
  pvVar3 = local_178.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_178.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_178.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0;
    pvVar4 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)local_178.
                super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    do {
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)&local_158,local_80 + uVar6);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)pvVar4,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)&local_158);
      std::
      _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_158);
      pvVar4 = pvVar4 + 0x18;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (pvVar4 != (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                        *)pvVar3);
  }
  uVar1 = ((Field_operators *)local_100._0_8_)->characteristic_;
  uVar5 = 3;
  if ((int)uVar1 < 4) {
    uVar5 = (undefined4)(3 % (ulong)uVar1);
  }
  local_158._M_impl._0_4_ = uVar5;
  Gudhi::persistence_matrix::
  _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
            ((Field_element *)&local_158,local_a8 + 5,local_a8 + 3);
  Gudhi::persistence_matrix::
  _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
            ((Field_element *)&local_158,local_80 + 5,local_80 + 3);
  local_158._M_impl._0_8_ = 0x400000000;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
  local_158._M_impl.super__Rb_tree_header._M_header._4_4_ = 2;
  local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x400000002;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_120.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3),&local_158);
  local_158._M_impl._0_8_ = 0x300000003;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = 5;
  local_158._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_178.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x48),&local_158);
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>
            (&local_120,
             (Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>
              *)local_100);
  pvVar3 = local_178.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_178.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_178.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0;
    pvVar4 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)local_178.
                super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    do {
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)&local_158,local_80 + uVar6);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)pvVar4,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)&local_158);
      std::
      _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_158);
      pvVar4 = pvVar4 + 0x18;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (pvVar4 != (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                        *)pvVar3);
  }
  uVar1 = ((Field_operators *)local_100._0_8_)->characteristic_;
  uVar5 = 4;
  if ((int)uVar1 < 5) {
    uVar5 = (undefined4)(4 % (ulong)uVar1);
  }
  local_158._M_impl._0_4_ = uVar5;
  Gudhi::persistence_matrix::
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
            ((Field_element *)&local_158,local_a8 + 5,local_a8 + 4);
  Gudhi::persistence_matrix::
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
            ((Field_element *)&local_158,local_80 + 5,local_80 + 4);
  local_158._M_impl._0_8_ = 0x400000000;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
  local_158._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_120.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4),&local_158);
  local_158._M_impl._0_8_ = 0x100000004;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = 5;
  local_158._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_178.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x60),&local_158);
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>
            (&local_120,
             (Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>
              *)local_100);
  pvVar3 = local_178.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_178.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_178.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0;
    pvVar4 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)local_178.
                super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    do {
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)&local_158,local_80 + uVar6);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)pvVar4,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
                  *)&local_158);
      std::
      _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_158);
      pvVar4 = pvVar4 + 0x18;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (pvVar4 != (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                        *)pvVar3);
  }
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_178);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>
  ::~Matrix((Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>
             *)local_100);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_120);
  return;
}

Assistant:

void test_ru_operation() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  columns[5].clear();

  std::vector<witness_content<typename Matrix::Column> > uColumns(7);
  if constexpr (Matrix::Option_list::is_z2) {
    uColumns[0] = {0};
    uColumns[1] = {1};
    uColumns[2] = {2};
    uColumns[3] = {3, 5};
    uColumns[4] = {4, 5};
    uColumns[5] = {5};
    uColumns[6] = {6};
  } else {
    uColumns[0] = {{0, 1}};
    uColumns[1] = {{1, 1}};
    uColumns[2] = {{2, 1}};
    uColumns[3] = {{3, 1}};
    uColumns[4] = {{4, 1}};
    uColumns[5] = {{3, 4}, {4, 4}, {5, 1}};
    uColumns[6] = {{6, 1}};
  }

  test_content_equality(columns, m);
  unsigned int i = 0;
  if constexpr (is_indexed_by_position<Matrix>()) {
    for (auto& b : uColumns) {
      test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++, false)));
    }
  }

  m.add_to(3, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {0, 1};
    uColumns[3] = {3};
  } else {
    columns[5] = {{0, 1}, {1, 4}};
    uColumns[5] = {{4, 4}, {5, 1}};
  }
  test_content_equality(columns, m);
  if constexpr (is_indexed_by_position<Matrix>()) {
    i = 0;
    for (auto& b : uColumns) {
      test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++, false)));
    }
  }

  m.add_to(4, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {0, 2};
    uColumns[4] = {4};
  } else {
    columns[5] = {{0, 1}, {2, 4}};
    uColumns[5] = {{5, 1}};
  }
  test_content_equality(columns, m);
  if constexpr (is_indexed_by_position<Matrix>()) {
    i = 0;
    for (auto& b : uColumns) {
      test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++, false)));
    }
  }

  if constexpr (!Matrix::Option_list::is_z2 || !is_RU<Matrix>()) {
    m.multiply_target_and_add_to(5, 3, 3);
    if constexpr (Matrix::Option_list::is_z2) {
      columns[3] = {1, 2};
      uColumns[5] = {3, 5};
    } else {
      columns[3] = {{0, 4}, {1, 2}, {2, 4}};
      uColumns[3] = {{3, 3}, {5, 1}};
    }
    test_content_equality(columns, m);
    if constexpr (is_indexed_by_position<Matrix>()) {
      i = 0;
      for (auto& b : uColumns) {
        test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++, false)));
      }
    }

    m.multiply_source_and_add_to(4, 5, 4);
    if constexpr (Matrix::Option_list::is_z2) {
      columns[4] = {1, 2};
      uColumns[4] = {4};
    } else {
      columns[4] = {{0, 4}, {1, 1}};
      uColumns[4] = {{4, 1}, {5, 4}};
    }
    test_content_equality(columns, m);
    if constexpr (is_indexed_by_position<Matrix>()) {
      i = 0;
      for (auto& b : uColumns) {
        test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++, false)));
      }
    }
  }
}